

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

int dotypeinv(void)

{
  nh_menuitem *pnVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  obj *poVar5;
  long lVar6;
  obj *poVar7;
  long lVar8;
  long lVar9;
  char cVar10;
  char *pcVar11;
  obj *poVar12;
  obj **ppoVar13;
  bool bVar14;
  object_pick *dummy;
  int pick_list [30];
  menulist local_d8;
  int local_c4;
  int local_c0;
  int local_bc;
  char *local_b8;
  obj *local_b0;
  int local_a8 [30];
  
  if (u.ushops[0] == '\0') {
    bVar14 = false;
  }
  else {
    iVar3 = doinvbill(0);
    bVar14 = iVar3 != 0;
  }
  poVar5 = invent;
  ppoVar13 = &invent;
  if (invent == (obj *)0x0 && bVar14 == false) {
    pcVar11 = "You aren\'t carrying anything.";
  }
  else {
    iVar3 = count_unpaid(invent);
    iVar4 = query_category("What type of object do you want an inventory of?",poVar5,
                           (uint)bVar14 << 5 | 2,local_a8,1);
    poVar5 = invent;
    if (iVar4 == 0) {
      return 0;
    }
    this_type = (int)(char)local_a8[0];
    if (local_a8[0] << 0x18 == 0x75000000) {
      if (iVar3 != 0) {
        local_c4 = count_unpaid(invent);
        if (local_c4 == 1) {
          local_b0 = (obj *)0x0;
          poVar5 = find_unpaid(poVar5,&local_b0);
          do {
            ppoVar13 = &((obj *)ppoVar13)->nobj->nobj;
            if ((obj *)ppoVar13 == (obj *)0x0) break;
          } while ((obj *)ppoVar13 != poVar5);
          pcVar11 = distant_name(poVar5,doname);
          if ((obj *)ppoVar13 == (obj *)0x0) {
            cVar10 = '>';
          }
          else {
            cVar10 = poVar5->invlet;
          }
          lVar6 = unpaid_cost(poVar5);
          xprname(poVar5,pcVar11,cVar10,'\x01',lVar6,0);
          pline("%s",xprname::li);
          return 0;
        }
        init_menulist(&local_d8);
        local_b8 = flags.inv_order;
        lVar6 = 0;
        iVar3 = 0;
        do {
          if (invent != (obj *)0x0) {
            local_c0 = 0;
            poVar5 = invent;
            do {
              if ((poVar5->field_0x4a & 4) != 0) {
                cVar10 = poVar5->invlet;
                if (flags.sortpack != '\0') {
                  if (poVar5->oclass != *local_b8) goto LAB_001b1b30;
                  if (local_c0 == 0) {
                    lVar8 = (long)local_d8.size;
                    local_bc = iVar3;
                    if (local_d8.size <= local_d8.icount) {
                      local_d8.size = local_d8.size * 2;
                      local_d8.items = (nh_menuitem *)realloc(local_d8.items,lVar8 * 0x218);
                    }
                    pnVar1 = local_d8.items + local_d8.icount;
                    pnVar1->id = 0;
                    pnVar1->role = MI_TEXT;
                    pnVar1->accel = '\0';
                    pnVar1->group_accel = '\0';
                    pnVar1->selected = '\0';
                    local_c0 = 1;
                    pcVar11 = let_to_name(*local_b8,'\x01');
                    strcpy(pnVar1->caption,pcVar11);
                    local_d8.icount = local_d8.icount + 1;
                    iVar3 = local_bc;
                  }
                }
                local_bc = iVar3;
                lVar8 = unpaid_cost(poVar5);
                uVar2 = *(uint *)&poVar5->field_0x4a;
                *(uint *)&poVar5->field_0x4a = uVar2 & 0xfffffffb;
                lVar9 = (long)local_d8.size;
                if (local_d8.size <= local_d8.icount) {
                  local_d8.size = local_d8.size * 2;
                  local_d8.items = (nh_menuitem *)realloc(local_d8.items,lVar9 * 0x218);
                }
                lVar6 = lVar6 + lVar8;
                pnVar1 = local_d8.items + local_d8.icount;
                pnVar1->id = 0;
                pnVar1->role = MI_TEXT;
                pnVar1->accel = '\0';
                pnVar1->group_accel = '\0';
                pnVar1->selected = '\0';
                pcVar11 = distant_name(poVar5,doname);
                xprname(poVar5,pcVar11,cVar10,'\x01',lVar8,0);
                strcpy(pnVar1->caption,xprname::li);
                local_d8.icount = local_d8.icount + 1;
                *(uint *)&poVar5->field_0x4a = *(uint *)&poVar5->field_0x4a & 0xfffffffb | uVar2 & 4
                ;
                iVar3 = local_bc + 1;
              }
LAB_001b1b30:
              poVar5 = poVar5->nobj;
            } while (poVar5 != (obj *)0x0);
          }
          if (flags.sortpack == '\0') {
            poVar5 = invent;
            if (invent != (obj *)0x0 && iVar3 < local_c4) goto LAB_001b1d74;
            goto LAB_001b1c17;
          }
          pcVar11 = local_b8 + 1;
          local_b8 = local_b8 + 1;
        } while (*pcVar11 != '\0');
        if (iVar3 < local_c4) {
          lVar8 = (long)local_d8.size;
          if (local_d8.size <= local_d8.icount) {
            local_d8.size = local_d8.size * 2;
            local_d8.items = (nh_menuitem *)realloc(local_d8.items,lVar8 * 0x218);
          }
          pnVar1 = local_d8.items + local_d8.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          pcVar11 = let_to_name('>','\x01');
          strcpy(pnVar1->caption,pcVar11);
          local_d8.icount = local_d8.icount + 1;
          for (poVar5 = invent; poVar5 != (obj *)0x0; poVar5 = poVar5->nobj) {
LAB_001b1d74:
            poVar12 = poVar5->cobj;
            if (poVar12 != (obj *)0x0) {
              local_b0 = (obj *)0x0;
              while (poVar7 = find_unpaid(poVar12,&local_b0), poVar12 = local_b0,
                    poVar7 != (obj *)0x0) {
                lVar8 = unpaid_cost(local_b0);
                uVar2 = *(uint *)&poVar12->field_0x4a;
                *(uint *)&poVar12->field_0x4a = uVar2 & 0xfffffffb;
                lVar9 = (long)local_d8.size;
                if (local_d8.size <= local_d8.icount) {
                  local_d8.size = local_d8.size * 2;
                  local_d8.items = (nh_menuitem *)realloc(local_d8.items,lVar9 * 0x218);
                }
                lVar6 = lVar6 + lVar8;
                pnVar1 = local_d8.items + local_d8.icount;
                pnVar1->id = 0;
                pnVar1->role = MI_TEXT;
                pnVar1->accel = '\0';
                pnVar1->group_accel = '\0';
                pnVar1->selected = '\0';
                pcVar11 = distant_name(poVar12,doname);
                xprname(poVar12,pcVar11,'>','\x01',lVar8,0);
                strcpy(pnVar1->caption,xprname::li);
                local_d8.icount = local_d8.icount + 1;
                *(uint *)&poVar12->field_0x4a =
                     *(uint *)&poVar12->field_0x4a & 0xfffffffb | uVar2 & 4;
                poVar12 = poVar5->cobj;
              }
            }
          }
        }
LAB_001b1c17:
        lVar8 = (long)local_d8.size;
        if (local_d8.size <= local_d8.icount) {
          local_d8.size = local_d8.size * 2;
          local_d8.items = (nh_menuitem *)realloc(local_d8.items,lVar8 * 0x218);
        }
        lVar8 = (long)local_d8.icount;
        local_d8.items[lVar8].accel = '\0';
        local_d8.items[lVar8].group_accel = '\0';
        local_d8.items[lVar8].selected = '\0';
        local_d8.items[lVar8].caption[0] = '\0';
        local_d8.items[lVar8].id = 0;
        local_d8.items[lVar8].role = MI_TEXT;
        local_d8.icount = local_d8.icount + 1;
        lVar8 = (long)local_d8.size;
        if (local_d8.size <= local_d8.icount) {
          local_d8.size = local_d8.size * 2;
          local_d8.items = (nh_menuitem *)realloc(local_d8.items,lVar8 * 0x218);
        }
        pnVar1 = local_d8.items + local_d8.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        pcVar11 = currency(lVar6);
        sprintf(xprname::li,"%c - %-45s %6ld %s",0x2a,"Total:",lVar6,pcVar11);
        strcpy(pnVar1->caption,xprname::li);
        local_d8.icount = local_d8.icount + 1;
        display_menu(local_d8.items,local_d8.icount,(char *)0x0,0,(int *)0x0);
        goto LAB_001b1d27;
      }
      pcVar11 = "You are not carrying any unpaid objects.";
    }
    else {
      if (local_a8[0] << 0x18 != 0x78000000) {
        check_tutorial_oclass(this_type);
        iVar3 = query_objlist((char *)0x0,invent,0xc,(object_pick **)&local_d8,-1,this_type_only);
        if (iVar3 < 1) {
          return 0;
        }
LAB_001b1d27:
        free(local_d8.items);
        return 0;
      }
      if (bVar14 != false) {
        doinvbill(1);
        return 0;
      }
      pcVar11 = "No used-up objects on your shopping bill.";
    }
  }
  pline(pcVar11);
  return 0;
}

Assistant:

int dotypeinv(void)
{
	char c = '\0';
	int n, i = 0;
	int unpaid_count;
	boolean billx = *u.ushops && doinvbill(0);
	int pick_list[30];
	struct object_pick *dummy;
	const char *prompt = "What type of object do you want an inventory of?";

	if (!invent && !billx) {
	    pline("You aren't carrying anything.");
	    return 0;
	}
	unpaid_count = count_unpaid(invent);
	
	i = UNPAID_TYPES;
	if (billx)
	    i |= BILLED_TYPES;
	n = query_category(prompt, invent, i, pick_list, PICK_ONE);
	if (!n)
	    return 0;
	this_type = c = pick_list[0];
	
	if (c == 'x') {
	    if (billx)
		doinvbill(1);
	    else
		pline("No used-up objects on your shopping bill.");
	    return 0;
	}
	if (c == 'u') {
	    if (unpaid_count)
		dounpaid();
	    else
		pline("You are not carrying any unpaid objects.");
	    return 0;
	}

	check_tutorial_oclass(this_type);

	if (query_objlist(NULL, invent, USE_INVLET | INVORDER_SORT,
			  &dummy, PICK_INVACTION, this_type_only) > 0)
	    free(dummy);
	return 0;
}